

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Init(sqlite3 *db,char **pzErrMsg)

{
  uint uVar1;
  sqlite3 *in_RDI;
  int commit_internal;
  int rc;
  int i;
  u32 in_stack_0000002c;
  char **in_stack_00000030;
  int in_stack_0000003c;
  sqlite3 *in_stack_00000040;
  int local_1c;
  int local_4;
  
  uVar1 = in_RDI->mDbFlags;
  in_RDI->enc = in_RDI->aDb->pSchema->enc;
  if (((in_RDI->aDb->pSchema->schemaFlags & 1) == 1) ||
     (local_4 = sqlite3InitOne(in_stack_00000040,in_stack_0000003c,in_stack_00000030,
                               in_stack_0000002c), local_4 == 0)) {
    local_1c = in_RDI->nDb;
    do {
      local_1c = local_1c + -1;
      if (local_1c < 1) {
        if ((uVar1 & 1) == 0) {
          sqlite3CommitInternalChanges(in_RDI);
        }
        return 0;
      }
    } while ((((in_RDI->aDb[local_1c].pSchema)->schemaFlags & 1) == 1) ||
            (local_4 = sqlite3InitOne(in_stack_00000040,in_stack_0000003c,in_stack_00000030,
                                      in_stack_0000002c), local_4 == 0));
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3Init(sqlite3 *db, char **pzErrMsg){
  int i, rc;
  int commit_internal = !(db->mDbFlags&DBFLAG_SchemaChange);

  assert( sqlite3_mutex_held(db->mutex) );
  assert( sqlite3BtreeHoldsMutex(db->aDb[0].pBt) );
  assert( db->init.busy==0 );
  ENC(db) = SCHEMA_ENC(db);
  assert( db->nDb>0 );
  /* Do the main schema first */
  if( !DbHasProperty(db, 0, DB_SchemaLoaded) ){
    rc = sqlite3InitOne(db, 0, pzErrMsg, 0);
    if( rc ) return rc;
  }
  /* All other schemas after the main schema. The "temp" schema must be last */
  for(i=db->nDb-1; i>0; i--){
    assert( i==1 || sqlite3BtreeHoldsMutex(db->aDb[i].pBt) );
    if( !DbHasProperty(db, i, DB_SchemaLoaded) ){
      rc = sqlite3InitOne(db, i, pzErrMsg, 0);
      if( rc ) return rc;
    }
  }
  if( commit_internal ){
    sqlite3CommitInternalChanges(db);
  }
  return SQLITE_OK;
}